

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_escaped_cp<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  basic_appender<char> bVar2;
  uint cp;
  byte *pbVar3;
  basic_appender<char> local_28;
  
  cp = escape->cp;
  local_28.container = out.container;
  if (cp == 9) {
    basic_appender<char>::operator=(&local_28,'\\');
    cp = 0x74;
    goto LAB_00158ef9;
  }
  if (cp != 0x5c) {
    if (cp == 0xd) {
      basic_appender<char>::operator=(&local_28,'\\');
      cp = 0x72;
      goto LAB_00158ef9;
    }
    if ((cp != 0x22) && (cp != 0x27)) {
      if (cp != 10) {
        if (cp < 0x100) {
          bVar2 = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',cp);
          return (basic_appender<char>)bVar2.container;
        }
        if (0xffff < cp) {
          if (0x10ffff < cp) {
            pbVar1 = (byte *)escape->end;
            for (pbVar3 = (byte *)escape->begin; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
              out = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',(uint)*pbVar3);
            }
            return (basic_appender<char>)out.container;
          }
          bVar2 = write_codepoint<8ul,char,fmt::v11::basic_appender<char>>(out,'U',cp);
          return (basic_appender<char>)bVar2.container;
        }
        bVar2 = write_codepoint<4ul,char,fmt::v11::basic_appender<char>>(out,'u',cp);
        return (basic_appender<char>)bVar2.container;
      }
      basic_appender<char>::operator=(&local_28,'\\');
      cp = 0x6e;
      goto LAB_00158ef9;
    }
  }
  basic_appender<char>::operator=(&local_28,'\\');
LAB_00158ef9:
  local_28.container = out.container;
  basic_appender<char>::operator=(&local_28,(char)cp);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':  FMT_FALLTHROUGH;
  case '\'': FMT_FALLTHROUGH;
  case '\\': *out++ = static_cast<Char>('\\'); break;
  default:
    if (escape.cp < 0x100) return write_codepoint<2, Char>(out, 'x', escape.cp);
    if (escape.cp < 0x10000)
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    if (escape.cp < 0x110000)
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}